

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_4dPoint * __thiscall
ON_XMLVariant::As4dPoint(ON_4dPoint *__return_storage_ptr__,ON_XMLVariant *this)

{
  bool bVar1;
  ON_XMLVariant *this_local;
  
  switch(this->_private->_type) {
  case String:
    bVar1 = ON_wString::IsValid4dPoint(&this->_private->_string_val);
    if (bVar1) {
      (*this->_vptr_ON_XMLVariant[0x31])(this,4);
    }
    break;
  case DoubleArray2:
    (this->_private->field_2).m_xform.m_xform[0][2] = 0.0;
  case DoubleArray3:
    (this->_private->field_2).m_xform.m_xform[0][3] = 0.0;
    break;
  case DoubleArray4:
  case DoubleColor4:
    break;
  default:
    __return_storage_ptr__->x = ON_4dPoint::Zero.x;
    __return_storage_ptr__->y = ON_4dPoint::Zero.y;
    __return_storage_ptr__->z = ON_4dPoint::Zero.z;
    __return_storage_ptr__->w = ON_4dPoint::Zero.w;
    return __return_storage_ptr__;
  }
  ON_4dPoint::ON_4dPoint
            (__return_storage_ptr__,(this->_private->field_2)._double_val,
             (this->_private->field_2).m_xform.m_xform[0][1],
             (this->_private->field_2).m_xform.m_xform[0][2],
             (this->_private->field_2).m_xform.m_xform[0][3]);
  return __return_storage_ptr__;
}

Assistant:

ON_4dPoint ON_XMLVariant::As4dPoint(void) const
{
  switch (_private->_type)
  {
  case Types::DoubleArray2:
    _private->_array_val[2] = 0.0;
  case Types::DoubleArray3:
    _private->_array_val[3] = 0.0;
    break;

  case Types::DoubleArray4:
  case Types::DoubleColor4:
    break;

  case Types::String:
    if (_private->_string_val.IsValid4dPoint())
      StringToPoint(4);
    break;

  default:
    return ON_4dPoint::Zero;
  }

  return ON_4dPoint(_private->_array_val[0], _private->_array_val[1], _private->_array_val[2], _private->_array_val[3]);
}